

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O1

exr_lineorder_t __thiscall Imf_3_4::Context::lineOrder(Context *this,int partidx)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *this_00;
  undefined4 in_register_00000034;
  exr_lineorder_t lo;
  stringstream _iex_throw_s;
  exr_lineorder_t local_1a4;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar1 = exr_get_lineorder(*(this->_ctxt).
                             super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,CONCAT44(in_register_00000034,partidx),&local_1a4);
  if (iVar1 == 0) {
    return local_1a4;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Unable to get the line order for part ",0x26);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,partidx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," in file \'",10);
  pcVar3 = fileName(this);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

exr_lineorder_t
Context::lineOrder (int partidx) const
{
    exr_lineorder_t lo;

    if (EXR_ERR_SUCCESS != exr_get_lineorder (*_ctxt, partidx, &lo))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get the line order for part " << partidx << " in file '"
                                                     << fileName () << "'");
    }

    return lo;
}